

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_consume(nghttp2_session *session,int32_t stream_id,size_t size)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  
  if (stream_id == 0) {
    return -0x1f5;
  }
  iVar1 = -0x207;
  if (((session->opt_flags & 1) != 0) &&
     (iVar1 = session_update_consumed_size
                        (session,&session->consumed_size,&session->recv_window_size,
                         session->window_update_queued,0,size,session->local_window_size),
     -0x385 < iVar1)) {
    pvVar3 = nghttp2_map_find(&session->streams,stream_id);
    if ((pvVar3 == (void *)0x0) || ((*(byte *)((long)pvVar3 + 0xd8) & 2) != 0)) {
      pvVar3 = (void *)0x0;
    }
    else if (*(int *)((long)pvVar3 + 0xcc) == 5) {
      pvVar3 = (void *)0x0;
    }
    iVar1 = 0;
    if (pvVar3 != (void *)0x0) {
      iVar2 = session_update_consumed_size
                        (session,(int32_t *)((long)pvVar3 + 0xb4),(int32_t *)((long)pvVar3 + 0xb0),
                         *(uint8_t *)((long)pvVar3 + 0xdb),*(int32_t *)((long)pvVar3 + 0xa8),size,
                         *(int32_t *)((long)pvVar3 + 0xbc));
      iVar1 = 0;
      if (iVar2 < -900) {
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_consume(nghttp2_session *session, int32_t stream_id,
                            size_t size) {
  int rv;
  nghttp2_stream *stream;

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, stream_id);

  if (!stream) {
    return 0;
  }

  rv = session_update_stream_consumed_size(session, stream, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}